

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intel_nuc5.c
# Opt level: O3

mraa_board_t * mraa_intel_nuc5(void)

{
  bool bVar1;
  int iVar2;
  mraa_board_t *__ptr;
  mraa_adv_func_t *__ptr_00;
  mraa_pininfo_t *pmVar3;
  bool bVar4;
  long lVar5;
  int iVar6;
  
  __ptr = (mraa_board_t *)calloc(1,0x5f0);
  if (__ptr != (mraa_board_t *)0x0) {
    __ptr->platform_name = "Intel NUC5";
    __ptr->phy_pin_count = 0x12;
    __ptr_00 = (mraa_adv_func_t *)calloc(1,0x288);
    __ptr->adv_func = __ptr_00;
    if (__ptr_00 != (mraa_adv_func_t *)0x0) {
      pmVar3 = (mraa_pininfo_t *)calloc(0x12,0x2f4);
      __ptr->pins = pmVar3;
      if (pmVar3 != (mraa_pininfo_t *)0x0) {
        builtin_strncpy(pmVar3->name,"1.8v",5);
        pmVar3->name[5] = '\0';
        pmVar3->name[6] = '\0';
        pmVar3->name[7] = '\0';
        *(undefined1 *)&pmVar3->capabilities = 1;
        pmVar3[1].name[0] = 'G';
        pmVar3[1].name[1] = 'N';
        pmVar3[1].name[2] = 'D';
        pmVar3[1].name[3] = '\0';
        pmVar3[1].name[4] = '\0';
        pmVar3[1].name[5] = '\0';
        pmVar3[1].name[6] = '\0';
        pmVar3[1].name[7] = '\0';
        *(undefined1 *)&pmVar3[1].capabilities = 1;
        pmVar3[2].name[0] = 'H';
        pmVar3[2].name[1] = 'D';
        pmVar3[2].name[2] = 'M';
        pmVar3[2].name[3] = 'I';
        pmVar3[2].name[4] = 'c';
        pmVar3[2].name[5] = 'e';
        pmVar3[2].name[6] = 'c';
        pmVar3[2].name[7] = '\0';
        *(undefined1 *)&pmVar3[2].capabilities = 1;
        pmVar3[3].name[0] = 'D';
        pmVar3[3].name[1] = 'M';
        pmVar3[3].name[2] = 'I';
        pmVar3[3].name[3] = 'C';
        pmVar3[3].name[4] = 'c';
        pmVar3[3].name[5] = 'l';
        pmVar3[3].name[6] = 'k';
        pmVar3[3].name[7] = '\0';
        *(undefined1 *)&pmVar3[3].capabilities = 1;
        pmVar3[4].name[0] = '3';
        pmVar3[4].name[1] = '.';
        pmVar3[4].name[2] = '3';
        pmVar3[4].name[3] = 'v';
        pmVar3[4].name[4] = '\0';
        pmVar3[4].name[5] = '\0';
        pmVar3[4].name[6] = '\0';
        pmVar3[4].name[7] = '\0';
        *(undefined1 *)&pmVar3[4].capabilities = 1;
        pmVar3[5].name[0] = 'D';
        pmVar3[5].name[1] = 'M';
        pmVar3[5].name[2] = 'I';
        pmVar3[5].name[3] = 'C';
        pmVar3[5].name[4] = 'd';
        pmVar3[5].name[5] = 'a';
        pmVar3[5].name[6] = '\0';
        pmVar3[5].name[7] = '\0';
        *(undefined1 *)&pmVar3[5].capabilities = 1;
        pmVar3[6].name[0] = 'K';
        pmVar3[6].name[1] = 'e';
        pmVar3[6].name[2] = 'y';
        pmVar3[6].name[3] = '\0';
        pmVar3[6].name[4] = '\0';
        pmVar3[6].name[5] = '\0';
        pmVar3[6].name[6] = '\0';
        pmVar3[6].name[7] = '\0';
        *(undefined1 *)&pmVar3[6].capabilities = 1;
        pmVar3[7].name[0] = 'S';
        pmVar3[7].name[1] = 'M';
        pmVar3[7].name[2] = 'B';
        pmVar3[7].name[3] = '-';
        pmVar3[7].name[4] = 'A';
        pmVar3[7].name[5] = '\0';
        pmVar3[7].name[6] = '\0';
        pmVar3[7].name[7] = '\0';
        *(undefined1 *)&pmVar3[7].capabilities = 1;
        pmVar3[8].name[0] = '5';
        pmVar3[8].name[1] = 'v';
        pmVar3[8].name[2] = '\0';
        pmVar3[8].name[3] = '\0';
        pmVar3[8].name[4] = '\0';
        pmVar3[8].name[5] = '\0';
        pmVar3[8].name[6] = '\0';
        pmVar3[8].name[7] = '\0';
        *(undefined1 *)&pmVar3[8].capabilities = 1;
        pmVar3[9].name[0] = 'S';
        pmVar3[9].name[1] = 'C';
        pmVar3[9].name[2] = 'I';
        pmVar3[9].name[3] = '\0';
        pmVar3[9].name[4] = '\0';
        pmVar3[9].name[5] = '\0';
        pmVar3[9].name[6] = '\0';
        pmVar3[9].name[7] = '\0';
        *(undefined1 *)&pmVar3[9].capabilities = 1;
        pmVar3[10].name[0] = 'P';
        pmVar3[10].name[1] = 'W';
        pmVar3[10].name[2] = 'M';
        pmVar3[10].name[3] = '0';
        pmVar3[10].name[4] = '\0';
        pmVar3[10].name[5] = '\0';
        pmVar3[10].name[6] = '\0';
        pmVar3[10].name[7] = '\0';
        *(undefined1 *)&pmVar3[10].capabilities = 1;
        pmVar3[0xb].name[0] = 'P';
        pmVar3[0xb].name[1] = 'W';
        pmVar3[0xb].name[2] = 'M';
        pmVar3[0xb].name[3] = '1';
        pmVar3[0xb].name[4] = '\0';
        pmVar3[0xb].name[5] = '\0';
        pmVar3[0xb].name[6] = '\0';
        pmVar3[0xb].name[7] = '\0';
        *(undefined1 *)&pmVar3[0xb].capabilities = 1;
        iVar6 = 1;
        pmVar3[0xb].pwm.parent_id = 1;
        pmVar3[0xc].name[0] = 'I';
        pmVar3[0xc].name[1] = '2';
        pmVar3[0xc].name[2] = 'C';
        pmVar3[0xc].name[3] = '0';
        pmVar3[0xc].name[4] = 'S';
        pmVar3[0xc].name[5] = 'C';
        pmVar3[0xc].name[6] = 'L';
        pmVar3[0xc].name[7] = '\0';
        *(undefined1 *)&pmVar3[0xc].capabilities = 0x21;
        pmVar3[0xc].i2c.pinmap = 1;
        pmVar3[0xd].name[0] = 'I';
        pmVar3[0xd].name[1] = '2';
        pmVar3[0xd].name[2] = 'C';
        pmVar3[0xd].name[3] = '0';
        pmVar3[0xd].name[4] = 'S';
        pmVar3[0xd].name[5] = 'D';
        pmVar3[0xd].name[6] = 'A';
        pmVar3[0xd].name[7] = '\0';
        *(undefined1 *)&pmVar3[0xd].capabilities = 0x21;
        pmVar3[0xd].i2c.pinmap = 1;
        pmVar3[0xe].name[0] = 'I';
        pmVar3[0xe].name[1] = '2';
        pmVar3[0xe].name[2] = 'C';
        pmVar3[0xe].name[3] = '1';
        pmVar3[0xe].name[4] = 'S';
        pmVar3[0xe].name[5] = 'C';
        pmVar3[0xe].name[6] = 'L';
        pmVar3[0xe].name[7] = '\0';
        *(undefined1 *)&pmVar3[0xe].capabilities = 0x21;
        pmVar3[0xe].i2c.pinmap = 1;
        pmVar3[0xf].name[0] = 'I';
        pmVar3[0xf].name[1] = '2';
        pmVar3[0xf].name[2] = 'C';
        pmVar3[0xf].name[3] = '1';
        pmVar3[0xf].name[4] = 'S';
        pmVar3[0xf].name[5] = 'D';
        pmVar3[0xf].name[6] = 'A';
        pmVar3[0xf].name[7] = '\0';
        *(undefined1 *)&pmVar3[0xf].capabilities = 0x21;
        pmVar3[0xf].i2c.pinmap = 1;
        pmVar3[0x10].name[0] = 'S';
        pmVar3[0x10].name[1] = 'M';
        pmVar3[0x10].name[2] = 'B';
        pmVar3[0x10].name[3] = '_';
        pmVar3[0x10].name[4] = 'C';
        pmVar3[0x10].name[5] = 'L';
        pmVar3[0x10].name[6] = 'K';
        pmVar3[0x10].name[7] = '\0';
        *(undefined1 *)&pmVar3[0x10].capabilities = 1;
        pmVar3[0x11].name[0] = 'S';
        pmVar3[0x11].name[1] = 'M';
        pmVar3[0x11].name[2] = 'B';
        pmVar3[0x11].name[3] = '_';
        pmVar3[0x11].name[4] = 'S';
        pmVar3[0x11].name[5] = 'D';
        pmVar3[0x11].name[6] = 'A';
        pmVar3[0x11].name[7] = '\0';
        *(undefined1 *)&pmVar3[0x11].capabilities = 1;
        iVar2 = -1;
        lVar5 = 0;
        bVar1 = true;
        do {
          bVar4 = bVar1;
          iVar2 = mraa_find_i2c_bus("designware",iVar2 + 1);
          if (iVar2 == -1) {
            if (iVar6 == 1) {
              return __ptr;
            }
            break;
          }
          __ptr->i2c_bus_count = iVar6;
          __ptr->i2c_bus[lVar5].bus_id = iVar2;
          __ptr->i2c_bus[lVar5].sda = (int)lVar5 * 2 + 0xc;
          __ptr->i2c_bus[lVar5].scl = (int)lVar5 * 2 | 0xd;
          iVar6 = iVar6 + 1;
          lVar5 = 1;
          bVar1 = false;
        } while (bVar4);
        __ptr->def_i2c_bus = __ptr->i2c_bus[0].bus_id;
        return __ptr;
      }
      free(__ptr_00);
    }
    syslog(2,"nuc5: Platform failed to initialise");
    free(__ptr);
  }
  return (mraa_board_t *)0x0;
}

Assistant:

mraa_board_t*
mraa_intel_nuc5()
{
    mraa_board_t* b = (mraa_board_t*) calloc(1, sizeof(mraa_board_t));
    if (b == NULL) {
        return NULL;
    }

    b->platform_name = PLATFORM_NAME;
    b->phy_pin_count = MRAA_INTEL_NUC5_PINCOUNT;

    b->adv_func = (mraa_adv_func_t*) calloc(1, sizeof(mraa_adv_func_t));
    if (b->adv_func == NULL) {
        goto error;
    }

    b->pins = (mraa_pininfo_t*) calloc(MRAA_INTEL_NUC5_PINCOUNT,sizeof(mraa_pininfo_t));
    if (b->pins == NULL) {
        free(b->adv_func);
        goto error;
    }

    strncpy(b->pins[0].name, "1.8v", 8);
    b->pins[0].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[1].name, "GND", 8);
    b->pins[1].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[2].name, "HDMIcec", 8);
    b->pins[2].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[3].name, "DMICclk", 8);
    b->pins[3].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[4].name, "3.3v", 8);
    b->pins[4].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[5].name, "DMICda", 8);
    b->pins[5].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[6].name, "Key", 8);
    b->pins[6].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[7].name, "SMB-A", 8);
    b->pins[7].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[8].name, "5v", 8);
    b->pins[8].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[9].name, "SCI", 8);
    b->pins[9].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    strncpy(b->pins[10].name, "PWM0", 8);
    b->pins[10].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    b->pins[10].pwm.pinmap = 0;
    b->pins[10].pwm.parent_id = 0;
    b->pins[10].pwm.mux_total = 0;

    strncpy(b->pins[11].name, "PWM1", 8);
    b->pins[11].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    b->pins[11].pwm.pinmap = 0;
    b->pins[11].pwm.parent_id = 1;
    b->pins[11].pwm.mux_total = 0;

    strncpy(b->pins[12].name, "I2C0SCL", 8);
    b->pins[12].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[12].i2c.pinmap = 1;
    b->pins[12].i2c.mux_total = 0;

    strncpy(b->pins[13].name, "I2C0SDA", 8);
    b->pins[13].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[13].i2c.pinmap = 1;
    b->pins[13].i2c.mux_total = 0;

    strncpy(b->pins[14].name, "I2C1SCL", 8);
    b->pins[14].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[14].i2c.pinmap = 1;
    b->pins[14].i2c.mux_total = 0;

    strncpy(b->pins[15].name, "I2C1SDA", 8);
    b->pins[15].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 1, 0, 0 };
    b->pins[15].i2c.pinmap = 1;
    b->pins[15].i2c.mux_total = 0;

    strncpy(b->pins[16].name, "SMB_CLK", 8);
    b->pins[16].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };
    strncpy(b->pins[17].name, "SMB_SDA", 8);
    b->pins[17].capabilities = (mraa_pincapabilities_t){ 1, 0, 0, 0, 0, 0, 0, 0 };

    b->i2c_bus_count = 0;
    int i2c_num = -1;
    int i;
    for (i = 0; i < 2; i++) {
        i2c_num = mraa_find_i2c_bus(I2CNAME, i2c_num + 1);
        if (i2c_num == -1) {
            break;
        }
        b->i2c_bus_count++;
        b->i2c_bus[i].bus_id = i2c_num;
        b->i2c_bus[i].sda = 12 + (i*2);
        b->i2c_bus[i].scl = 13 + (i*2);
    }

    if (b->i2c_bus_count > 0) {
        b->def_i2c_bus = b->i2c_bus[0].bus_id;
    }

    return b;
error:
    syslog(LOG_CRIT, "nuc5: Platform failed to initialise");
    free(b);
    return NULL;
}